

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nodes3.cc
# Opt level: O3

int __thiscall Node::OutputPrintData(Node *this,ostream *os,int InputFlag)

{
  int iVar1;
  ostream *poVar2;
  Node *this_00;
  Node *this_01;
  bool bVar3;
  string local_60;
  string local_40;
  
  this_01 = this;
  while (iVar1 = this_01->Type, iVar1 == 0x1f5) {
    this = this_01->Tree[0];
    if (this == (Node *)0x0) {
      bVar3 = true;
    }
    else {
      iVar1 = OutputPrintData(this,os,InputFlag);
      bVar3 = iVar1 != 2;
    }
    if (((bVar3) && (*(this_01->TextValue)._M_dataplus._M_p == ',')) && (IOUsing == (Node *)0x0)) {
      OutputIPChannel(this,os,InputFlag);
      this = (Node *)os;
      std::__ostream_insert<char,std::char_traits<char>>(os," << \'\\t\'",8);
    }
    this_01 = this_01->Tree[1];
    if (this_01 == (Node *)0x0) {
      return 0;
    }
  }
  if (iVar1 < 0x1d4) {
    if (iVar1 == 0x23) {
      IOChannel = this_01;
      return 2;
    }
    if (iVar1 == 0x1b1) {
      IOUsing = this_01->Tree[0];
      iVar1 = 0;
      if (0 < Level) {
        iVar1 = Level;
      }
      local_60._M_dataplus._M_p = (pointer)&local_60.field_2;
      std::__cxx11::string::_M_construct((ulong)&local_60,(char)iVar1);
      poVar2 = std::__ostream_insert<char,std::char_traits<char>>
                         (os,local_60._M_dataplus._M_p,local_60._M_string_length);
      std::__ostream_insert<char,std::char_traits<char>>(poVar2,"PUse.SetFormat(",0xf);
      Expression_abi_cxx11_(&local_40,IOUsing);
      poVar2 = std::__ostream_insert<char,std::char_traits<char>>
                         (poVar2,local_40._M_dataplus._M_p,local_40._M_string_length);
      std::__ostream_insert<char,std::char_traits<char>>(poVar2,");",2);
      std::ios::widen((char)*(undefined8 *)(*(long *)poVar2 + -0x18) + (char)poVar2);
      std::ostream::put((char)poVar2);
      std::ostream::flush();
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_40._M_dataplus._M_p != &local_40.field_2) {
        operator_delete(local_40._M_dataplus._M_p,local_40.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_60._M_dataplus._M_p == &local_60.field_2) {
        return 2;
      }
LAB_0011e73d:
      operator_delete(local_60._M_dataplus._M_p,local_60.field_2._M_allocated_capacity + 1);
      return 2;
    }
  }
  else {
    if (iVar1 == 0x1d4) {
      OutputIPChannel(this,os,0);
      if (IOUsing == (Node *)0x0) {
        std::__ostream_insert<char,std::char_traits<char>>(os," << ",4);
        Expression_abi_cxx11_(&local_60,this_01);
        std::__ostream_insert<char,std::char_traits<char>>
                  (os,local_60._M_dataplus._M_p,local_60._M_string_length);
        goto LAB_0011e9c1;
      }
      std::__ostream_insert<char,std::char_traits<char>>(os," << PUse.Output(",0x10);
      Expression_abi_cxx11_(&local_60,this_01);
      poVar2 = std::__ostream_insert<char,std::char_traits<char>>
                         (os,local_60._M_dataplus._M_p,local_60._M_string_length);
      std::__ostream_insert<char,std::char_traits<char>>(poVar2,");",2);
      std::ios::widen((char)*(undefined8 *)(*(long *)poVar2 + -0x18) + (char)poVar2);
      std::ostream::put((char)poVar2);
      std::ostream::flush();
      goto LAB_0011e8c5;
    }
    if (iVar1 == 0x206) {
      OutputIPChannel(this,os,InputFlag);
      std::__ostream_insert<char,std::char_traits<char>>(os," << RECORD(",0xb);
      Expression_abi_cxx11_(&local_60,this_01->Tree[0]);
      poVar2 = std::__ostream_insert<char,std::char_traits<char>>
                         (os,local_60._M_dataplus._M_p,local_60._M_string_length);
      std::__ostream_insert<char,std::char_traits<char>>(poVar2,")",1);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_60._M_dataplus._M_p == &local_60.field_2) {
        return 2;
      }
      goto LAB_0011e73d;
    }
  }
  this_00 = this_01;
  iVar1 = CheckCpos(this_01);
  if (iVar1 != 0) {
    std::__ostream_insert<char,std::char_traits<char>>(os,";",1);
    std::ios::widen((char)*(undefined8 *)(*(long *)os + -0x18) + (char)os);
    this_00 = (Node *)std::ostream::put((char)os);
    std::ostream::flush();
    IOChPrinted = 0;
  }
  OutputIPChannel(this_00,os,InputFlag);
  if (IOUsing == (Node *)0x0) {
    iVar1 = IsNumber(this_01);
    if (iVar1 == 0) {
      std::__ostream_insert<char,std::char_traits<char>>(os," << ",4);
      Expression_abi_cxx11_(&local_60,this_01);
      std::__ostream_insert<char,std::char_traits<char>>
                (os,local_60._M_dataplus._M_p,local_60._M_string_length);
    }
    else {
      std::__ostream_insert<char,std::char_traits<char>>(os," << \' \'",7);
      std::__ostream_insert<char,std::char_traits<char>>(os," << ",4);
      Expression_abi_cxx11_(&local_60,this_01);
      poVar2 = std::__ostream_insert<char,std::char_traits<char>>
                         (os,local_60._M_dataplus._M_p,local_60._M_string_length);
      std::__ostream_insert<char,std::char_traits<char>>(poVar2," << \' \'",7);
    }
LAB_0011e9c1:
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_60._M_dataplus._M_p == &local_60.field_2) {
      return 1;
    }
    operator_delete(local_60._M_dataplus._M_p,local_60.field_2._M_allocated_capacity + 1);
    return 1;
  }
  std::__ostream_insert<char,std::char_traits<char>>(os," << PUse.Output(",0x10);
  Expression_abi_cxx11_(&local_60,this_01);
  poVar2 = std::__ostream_insert<char,std::char_traits<char>>
                     (os,local_60._M_dataplus._M_p,local_60._M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>(poVar2,");",2);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar2 + -0x18) + (char)poVar2);
  std::ostream::put((char)poVar2);
  std::ostream::flush();
LAB_0011e8c5:
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_60._M_dataplus._M_p != &local_60.field_2) {
    operator_delete(local_60._M_dataplus._M_p,local_60.field_2._M_allocated_capacity + 1);
  }
  IOChPrinted = 0;
  return 1;
}

Assistant:

int Node::OutputPrintData(
	std::ostream& os,	/**< Channel to write C++ code to */
	int InputFlag		/**< Specifies if it is working on 
				 * an input statement, ie. specifies the 
				 * direction of the arrows. 
				 */
)
{
	int ReturnFlag;		// Does a return seem to be needed
				//   Gets set to one if the print/Input command
				//   ends with a ',' or ';'.
	int TestFlag = 0;	// Test for special item

	//
	// Is this a piece of a list?
	//
	switch (Type)
	{
	case BAS_N_LIST:
		//
		// Try the left side of the tree
		//
		if (Tree[0] != 0)
		{
			TestFlag = Tree[0]->OutputPrintData(os, InputFlag);
		}

		//
		// Do we need to append a tab between fields?
		// Only do so for print statements.
		//
		if ((TextValue[0] == ',') &&
			(TestFlag != 2) && (IOUsing == 0))
		{
			OutputIPChannel(os, InputFlag);
			os << " << '\\t'";
		}

		//
		// Handle right side of the tree
		//
		if (Tree[1] != 0)
		{
			ReturnFlag = Tree[1]->OutputPrintData(os, InputFlag);
		}
		else
		{
			ReturnFlag = 0;
		}

		break;

	case '#':
		IOChannel = this;
		ReturnFlag = 2;
		break;

	case BAS_S_USING:
		IOUsing = Tree[0];
		ReturnFlag = 2;

		os << Indent() << "PUse.SetFormat(" << IOUsing->Expression() <<
			");" << std::endl;

		break;

	case BAS_N_RECORD:
		OutputIPChannel(os, InputFlag);
		os << " << RECORD(" << Tree[0]->Expression() << ")";
		ReturnFlag = 2;
		break;

	case BAS_V_TEXTSTRING:
		OutputIPChannel(os, 0);

		//
		// Put a comma in print using statements, else
		// out out a '<<'.
		//
		if (IOUsing != 0)
		{
			os << " << PUse.Output(" << Expression() << ");" << std::endl;
			IOChPrinted = 0;
		}
		else
		{
			os << " << " << Expression();
		}
		ReturnFlag = 1;

		break;


	default:


		//
		// Print
		//
		if (CheckCpos())
		{
			//
			// If we have an item that needs the current
			// cursor position to be correct, we have to put
			// it at tyhe beginning of an output statement
			//
			os << ";" << std::endl;
			IOChPrinted = 0;
		}

		OutputIPChannel(os, InputFlag);

		//
		// Put a comma in print using statements, else
		// out out a '<<'.
		//
		if (IOUsing != 0)
		{
			os << " << PUse.Output(" << Expression() << ");" << std::endl;
			IOChPrinted = 0;
		}
		else
		{
			if (IsNumber() != 0)
			{
				//
				// Basic puts either a '-' or a ' ' in front
				// of numbers, and as ' ' after the number.
				//
				// \note we are assuming positive numbers only,
				// because dealing with negitive ones gets ug;y
				// really fast.
				//
				os << " << ' '" <<
					" << " << Expression() <<
					" << ' '";
			}
			else
			{
				os << " << " << Expression();
			}
		}
		ReturnFlag = 1;
		break;
	}

	//
	// Done
	//
	return ReturnFlag;
}